

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O0

void ihevc_dpb_mgr_init(dpb_mgr_t *ps_dpb_mgr)

{
  dpb_info_t *ps_dpb_info;
  UWORD32 i;
  dpb_mgr_t *ps_dpb_mgr_local;
  
  for (i = 0; i < 0x40; i = i + 1) {
    ps_dpb_mgr->as_dpb_info[i].ps_prev_dpb = (dpb_info_t *)0x0;
    ps_dpb_mgr->as_dpb_info[i].ps_pic_buf = (pic_buf_t *)0x0;
  }
  ps_dpb_mgr->u1_num_ref_bufs = '\0';
  ps_dpb_mgr->ps_dpb_head = (dpb_info_t *)0x0;
  return;
}

Assistant:

void ihevc_dpb_mgr_init(dpb_mgr_t *ps_dpb_mgr)
{
    UWORD32 i;
    dpb_info_t *ps_dpb_info = ps_dpb_mgr->as_dpb_info;
    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        ps_dpb_info[i].ps_prev_dpb = NULL;
        ps_dpb_info[i].ps_pic_buf = NULL;

    }

    ps_dpb_mgr->u1_num_ref_bufs = 0;
    ps_dpb_mgr->ps_dpb_head = NULL;

}